

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 soft_float32_to_float64(float32 a,float_status *s)

{
  uint64_t uVar2;
  ulong uVar3;
  undefined8 uVar4;
  bool bVar5;
  FloatParts FVar6;
  FloatParts part;
  ulong uVar1;
  
  part._8_8_ = (ulong)(a >> 0x17) & 0xff | (ulong)(a & 0x80000000) << 9;
  part.frac = (ulong)(a & 0x7fffff);
  FVar6 = sf_canonicalize(part,&float32_params,s);
  uVar1 = FVar6.frac;
  if (float_class_inf < FVar6.cls) {
    if (FVar6.cls == float_class_snan) {
      s->float_exception_flags = s->float_exception_flags | 1;
      uVar3 = FVar6._8_8_ & 0xffffff00ffffffff | 0x400000000;
      FVar6.exp = (int)uVar3;
      FVar6.cls = (char)(uVar3 >> 0x20);
      FVar6.sign = (_Bool)(char)(uVar3 >> 0x28);
      FVar6._14_2_ = (short)(uVar3 >> 0x30);
      FVar6.frac = uVar1 | 0x2000000000000000;
    }
    uVar4 = FVar6._8_8_;
    uVar2 = FVar6.frac;
    bVar5 = s->default_nan_mode != '\0';
    if (bVar5) {
      uVar2 = 0x2000000000000000;
    }
    FVar6.exp = (int)uVar4;
    FVar6.cls = (char)((ulong)uVar4 >> 0x20);
    FVar6.sign = (_Bool)(char)((ulong)uVar4 >> 0x28);
    FVar6._14_2_ = (short)((ulong)uVar4 >> 0x30);
    FVar6.frac = uVar2;
    if (bVar5) {
      FVar6.exp = 0x7fffffff;
      FVar6.cls = float_class_qnan;
      FVar6.sign = false;
      FVar6._14_2_ = 0;
    }
  }
  FVar6 = round_canonical(FVar6,s,&float64_params);
  return FVar6.frac & 0xfffffffffffff | (ulong)(FVar6.exp & 0x7ff) << 0x34 |
         (FVar6._8_8_ & 0x10000000000) << 0x17;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_float32_to_float64(float32 a, float_status *s)
{
    FloatParts p = float32_unpack_canonical(a, s);
    FloatParts pr = float_to_float(p, &float64_params, s);
    return float64_round_pack_canonical(pr, s);
}